

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

void CopyTempOutputBuffersToHostOutputBuffers(PaUtilBufferProcessor *bp)

{
  bool bVar1;
  ulong local_50;
  ulong local_48;
  uint local_3c;
  uint local_38;
  uint i;
  uint srcChannelStrideBytes;
  uint srcSampleStrideSamples;
  uchar *srcBytePtr;
  PaUtilChannelDescriptor *pPStack_20;
  uint frameCount;
  PaUtilChannelDescriptor *hostOutputChannels;
  unsigned_long maxFramesToCopy;
  PaUtilBufferProcessor *bp_local;
  
  while( true ) {
    bVar1 = false;
    if (bp->framesInTempOutputBuffer != 0) {
      bVar1 = bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1] != 0;
    }
    if (!bVar1) break;
    local_50 = bp->framesInTempOutputBuffer;
    if (bp->hostOutputFrameCount[0] == 0) {
      pPStack_20 = bp->hostOutputChannels[1];
      if (bp->hostOutputFrameCount[1] < local_50) {
        local_50 = bp->hostOutputFrameCount[1];
      }
      srcBytePtr._4_4_ = (uint)local_50;
    }
    else {
      pPStack_20 = bp->hostOutputChannels[0];
      local_48 = local_50;
      if (bp->hostOutputFrameCount[0] < local_50) {
        local_48 = bp->hostOutputFrameCount[0];
      }
      srcBytePtr._4_4_ = (uint)local_48;
    }
    if (bp->userOutputIsInterleaved == 0) {
      _srcChannelStrideBytes =
           (void *)((long)bp->tempOutputBuffer +
                   (ulong)bp->bytesPerUserOutputSample *
                   (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer));
      i = 1;
      local_38 = (int)bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
    }
    else {
      _srcChannelStrideBytes =
           (void *)((long)bp->tempOutputBuffer +
                   (ulong)(bp->bytesPerUserOutputSample * bp->outputChannelCount) *
                   (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer));
      i = bp->outputChannelCount;
      local_38 = bp->bytesPerUserOutputSample;
    }
    for (local_3c = 0; local_3c < bp->outputChannelCount; local_3c = local_3c + 1) {
      if (pPStack_20[local_3c].data == (void *)0x0) {
        __assert_fail("hostOutputChannels[i].data != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/common/pa_process.c"
                      ,0x4e9,
                      "void CopyTempOutputBuffersToHostOutputBuffers(PaUtilBufferProcessor *)");
      }
      (*bp->outputConverter)
                (pPStack_20[local_3c].data,pPStack_20[local_3c].stride,_srcChannelStrideBytes,i,
                 srcBytePtr._4_4_,&bp->ditherGenerator);
      _srcChannelStrideBytes = (void *)((long)_srcChannelStrideBytes + (ulong)local_38);
      pPStack_20[local_3c].data =
           (void *)((long)pPStack_20[local_3c].data +
                   (ulong)(srcBytePtr._4_4_ * pPStack_20[local_3c].stride *
                          bp->bytesPerHostOutputSample));
    }
    if (bp->hostOutputFrameCount[0] == 0) {
      bp->hostOutputFrameCount[1] = bp->hostOutputFrameCount[1] - (ulong)srcBytePtr._4_4_;
    }
    else {
      bp->hostOutputFrameCount[0] = bp->hostOutputFrameCount[0] - (ulong)srcBytePtr._4_4_;
    }
    bp->framesInTempOutputBuffer = bp->framesInTempOutputBuffer - (ulong)srcBytePtr._4_4_;
  }
  return;
}

Assistant:

static void CopyTempOutputBuffersToHostOutputBuffers( PaUtilBufferProcessor *bp)
{
    unsigned long maxFramesToCopy;
    PaUtilChannelDescriptor *hostOutputChannels;
    unsigned int frameCount;
    unsigned char *srcBytePtr;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;

     /* copy frames from user to host output buffers */
     while( bp->framesInTempOutputBuffer > 0 &&
             ((bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1]) > 0) )
     {
         maxFramesToCopy = bp->framesInTempOutputBuffer;

         /* select the output buffer set (1st or 2nd) */
         if( bp->hostOutputFrameCount[0] > 0 )
         {
             hostOutputChannels = bp->hostOutputChannels[0];
             frameCount = PA_MIN_( bp->hostOutputFrameCount[0], maxFramesToCopy );
         }
         else
         {
             hostOutputChannels = bp->hostOutputChannels[1];
             frameCount = PA_MIN_( bp->hostOutputFrameCount[1], maxFramesToCopy );
         }

         if( bp->userOutputIsInterleaved )
         {
             srcBytePtr = ((unsigned char*)bp->tempOutputBuffer) +
                     bp->bytesPerUserOutputSample * bp->outputChannelCount *
                     (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer);
                         
             srcSampleStrideSamples = bp->outputChannelCount;
             srcChannelStrideBytes = bp->bytesPerUserOutputSample;
         }
         else /* user output is not interleaved */
         {
             srcBytePtr = ((unsigned char*)bp->tempOutputBuffer) +
                     bp->bytesPerUserOutputSample *
                     (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer);

             srcSampleStrideSamples = 1;
             srcChannelStrideBytes = bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
         }

         for( i=0; i<bp->outputChannelCount; ++i )
         {
             assert( hostOutputChannels[i].data != NULL );
             bp->outputConverter(    hostOutputChannels[i].data,
                                     hostOutputChannels[i].stride,
                                     srcBytePtr, srcSampleStrideSamples,
                                     frameCount, &bp->ditherGenerator );

             srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

             /* advance dest ptr for next iteration */
             hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                     frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
         }

         if( bp->hostOutputFrameCount[0] > 0 )
             bp->hostOutputFrameCount[0] -= frameCount;
         else
             bp->hostOutputFrameCount[1] -= frameCount;

         bp->framesInTempOutputBuffer -= frameCount;
     }
}